

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn.c
# Opt level: O0

void Qiniu_Free_CDNFluxRet(Qiniu_CDN_FluxRet *ret)

{
  int local_14;
  int i;
  Qiniu_CDN_FluxRet *ret_local;
  
  if (ret->data != (Qiniu_CDN_FluxData *)0x0) {
    for (local_14 = 0; local_14 < ret->domainsCount; local_14 = local_14 + 1) {
      if (ret->data[local_14].china != (Qiniu_Uint64 *)0x0) {
        Qiniu_Free(ret->data[local_14].china);
      }
      if (ret->data[local_14].oversea != (Qiniu_Uint64 *)0x0) {
        Qiniu_Free(ret->data[local_14].oversea);
      }
    }
    Qiniu_Free(ret->data);
  }
  return;
}

Assistant:

void Qiniu_Free_CDNFluxRet(Qiniu_CDN_FluxRet *ret) {
    int i;

    if (ret->data != NULL) {
        for (i = 0; i < ret->domainsCount; ++i) {
            if (ret->data[i].china != NULL) {
                Qiniu_Free(ret->data[i].china);
            }
            if (ret->data[i].oversea != NULL) {
                Qiniu_Free(ret->data[i].oversea);
            }
        }
        Qiniu_Free(ret->data);
    }
}